

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O1

void __thiscall Webcam::~Webcam(Webcam *this)

{
  int iVar1;
  undefined8 extraout_RAX;
  long lVar2;
  ulong uVar3;
  undefined1 local_14 [4];
  
  if (this->isOpen != true) {
    return;
  }
  if (((byte)isRun._M_base._M_i & 1) != 0) {
    LOCK();
    isRun._M_base._M_i = (__atomic_base<bool>)false;
    UNLOCK();
    std::thread::join();
  }
  iVar1 = xioctl(fd,0x40045613,local_14);
  if (iVar1 == -1) {
LAB_00117cf2:
    errno_exit("VIDIOC_STREAMOFF");
  }
  else {
    if (n_buffers != 0) {
      lVar2 = 8;
      uVar3 = 0;
      do {
        iVar1 = munmap(*(void **)((long)buffers + lVar2 + -8),
                       *(size_t *)((long)&buffers->start + lVar2));
        if (iVar1 == -1) {
          errno_exit("munmap");
          goto LAB_00117cf2;
        }
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (uVar3 < n_buffers);
    }
    free(buffers);
    iVar1 = close(fd);
    if (iVar1 != -1) {
      fd = -1;
      return;
    }
  }
  errno_exit("close");
  __clang_call_terminate(extraout_RAX);
  if (((byte)isRun._M_base._M_i & 1) == 0) {
    return;
  }
  LOCK();
  isRun._M_base._M_i = (__atomic_base<bool>)false;
  UNLOCK();
  std::thread::join();
  return;
}

Assistant:

Webcam::~Webcam()
{
    if(isOpen) {
        stop();
        stop_capturing ();
        uninit_device ();
        close_device ();
    }
}